

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

void ON_XMLNodePrivate::AttemptToFixTag(ON_wString *tag)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  wchar_t *pwVar4;
  ON_wString sNewTag;
  ON_wString sProp;
  ON_wString sName;
  
  pwVar4 = ON_wString::operator_cast_to_wchar_t_(tag);
  GetNameFromTag((ON_XMLNodePrivate *)&sName,pwVar4);
  bVar1 = ON_wString::IsEmpty(&sName);
  if (!bVar1) {
    iVar2 = ON_wString::Length(tag);
    if (1 < iVar2) {
      ON_wString::Right(&sNewTag,(int)tag);
      pwVar4 = ON_wString::operator_cast_to_wchar_t_(&sNewTag);
      iVar2 = wcscmp(pwVar4,L"/>");
      ON_wString::~ON_wString(&sNewTag);
      ON_wString::ON_wString(&sProp,L"<");
      ON_wString::operator+(&sNewTag,&sProp);
      ON_wString::~ON_wString(&sProp);
      ON_wString::ON_wString(&sProp);
      iVar3 = 0;
      while( true ) {
        iVar3 = ON_wString::Find(tag,L'=',iVar3);
        if (iVar3 < 0) break;
        bVar1 = RecoverProperty(tag,iVar3,&sProp);
        iVar3 = iVar3 + 1;
        if (bVar1) {
          ON_wString::operator+=(&sNewTag,L" ");
          ON_wString::operator+=(&sNewTag,&sProp);
        }
      }
      pwVar4 = L">";
      if (iVar2 == 0) {
        pwVar4 = L"/>";
      }
      ON_wString::operator+=(&sNewTag,pwVar4);
      ON_wString::operator=(tag,&sNewTag);
      ON_wString::~ON_wString(&sProp);
      ON_wString::~ON_wString(&sNewTag);
    }
  }
  ON_wString::~ON_wString(&sName);
  return;
}

Assistant:

void ON_XMLNodePrivate::AttemptToFixTag(ON_wString& tag) // Static.
{
  // We're going to rebuild the tag from the name and the number of valid properties we find.
  const ON_wString sName = GetNameFromTag(tag);
  if (sName.IsEmpty() || tag.Length() < 2)
    return;

  const bool bSelfClosingTag = (0 == wcscmp(tag.Right(2), L"/>"));

  ON_wString sNewTag = ON_wString(L"<") + sName;

  // Now find all of the potential properties - looking for = signs.
  int pos = 0;
  int equalSign = -1;
  ON_wString sProp;

  while ((equalSign = tag.Find(L'=', pos)) >= 0)
  {
    // Move the search past this one for next time around.
    pos = equalSign + 1;

    if (RecoverProperty(tag, equalSign, sProp))
    {
      sNewTag += L" ";
      sNewTag += sProp;
    }
  }

  if (bSelfClosingTag)
  {
    sNewTag += L"/>";
  }
  else
  {
    sNewTag += L">";
  }

  tag = sNewTag;
}